

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_crecord.c
# Opt level: O1

CTypeID crec_constructor(jit_State *J,GCcdata *cd,TRef tr)

{
  CTypeID k;
  TRef TVar1;
  TRef TVar2;
  
  k = (CTypeID)cd[1].nextgc.gcptr64;
  (J->fold).ins.field_0.op1 = (IRRef1)tr;
  *(undefined4 *)((long)&(J->fold).ins.field_1.op12 + 2) = 0x45130018;
  TVar1 = lj_opt_fold(J);
  TVar2 = lj_ir_kint(J,k);
  (J->fold).ins.field_0.ot = 0x893;
  (J->fold).ins.field_0.op1 = (IRRef1)TVar1;
  (J->fold).ins.field_0.op2 = (IRRef1)TVar2;
  lj_opt_fold(J);
  return k;
}

Assistant:

static CTypeID crec_constructor(jit_State *J, GCcdata *cd, TRef tr)
{
  CTypeID id;
  lj_assertJ(tref_iscdata(tr) && cd->ctypeid == CTID_CTYPEID,
	     "expected CTypeID cdata");
  id = *(CTypeID *)cdataptr(cd);
  tr = emitir(IRT(IR_FLOAD, IRT_INT), tr, IRFL_CDATA_INT);
  emitir(IRTG(IR_EQ, IRT_INT), tr, lj_ir_kint(J, (int32_t)id));
  return id;
}